

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_fix(lua_State *L,GCObject *o)

{
  global_State *pgVar1;
  
  pgVar1 = L->l_G;
  o->marked = o->marked & 0xfc;
  pgVar1->allgc = o->next;
  o->next = pgVar1->fixedgc;
  pgVar1->fixedgc = o;
  return;
}

Assistant:

void luaC_fix(lua_State *L, GCObject *o) {
    global_State *g = G(L);
    lua_assert(g->allgc == o);  /* object must be 1st in 'allgc' list! */
    white2gray(o);  /* they will be gray forever */
    g->allgc = o->next;  /* remove object from 'allgc' list */
    o->next = g->fixedgc;  /* link it to 'fixedgc' list */
    g->fixedgc = o;
}